

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AutoCloseFd> __thiscall
kj::AsyncCapabilityStream::receiveFd(AsyncCapabilityStream *this)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  long *in_RSI;
  Promise<kj::AutoCloseFd> PVar2;
  Own<kj::_::PromiseNode> OStack_58;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  (**(code **)(*in_RSI + 0x60))(&OStack_58);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&OStack_58,
             _::
             TransformPromiseNode<kj::Promise<kj::AutoCloseFd>,_kj::Maybe<kj::AutoCloseFd>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1834:30),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00432208;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::AutoCloseFd>,kj::Maybe<kj::AutoCloseFd>,kj::AsyncCapabilityStream::receiveFd()::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  _::maybeChain<kj::AutoCloseFd>(&local_38,(Promise<kj::AutoCloseFd> *)&intermediate);
  pPVar1 = local_38.ptr;
  local_28.disposer = local_38.disposer;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)local_38.disposer;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)pPVar1
  ;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&OStack_58);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}